

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O3

void gimage::createLaplacianPyramid<unsigned_char>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int j;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  long i;
  long lVar9;
  pointer pIVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  
  lVar5 = image->width;
  if (image->height < image->width) {
    lVar5 = image->height;
  }
  if ((int)lVar5 < 2) {
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::resize(p,0);
    return;
  }
  dVar16 = log((double)(int)lVar5);
  dVar16 = floor(dVar16 / 0.6931471805599453);
  iVar4 = (int)dVar16;
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(p,(long)iVar4);
  if ((iVar4 != 0) &&
     (Image<float,_gimage::PixelTraits<float>_>::setImage<unsigned_char>
                ((p->
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,image), 1 < iVar4)) {
    pIVar10 = (p->
              super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      uVar7 = uVar6 + 1;
      reduceGauss<float,float>(pIVar10 + uVar6 + 1,pIVar10 + uVar6);
      pIVar10 = (p->
                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0 < pIVar10[uVar6].depth) {
        lVar2 = pIVar10[uVar6].width;
        lVar3 = pIVar10[uVar6].height;
        lVar5 = lVar3 + -2;
        lVar11 = 0;
        if (0 < lVar5) {
          lVar11 = lVar5;
        }
        lVar12 = 0;
        do {
          if (0 < lVar3) {
            pfVar8 = *pIVar10[uVar6].img[lVar12];
            lVar14 = 0;
            do {
              j = (int)lVar12;
              if (0 < lVar2) {
                lVar13 = 0;
                lVar9 = 0;
                do {
                  fVar15 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7,lVar9,
                                      lVar14,j);
                  pfVar8[lVar9] = pfVar8[lVar9] - fVar15;
                  lVar9 = lVar9 + 1;
                  lVar13 = lVar13 + -4;
                } while (lVar2 != lVar9);
                pfVar8 = (float *)((long)pfVar8 - lVar13);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != (ulong)(lVar3 != 1) + 1);
            if (4 < lVar3) {
              lVar14 = 2;
              do {
                if (0 < lVar2) {
                  fVar15 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7,0,lVar14,j)
                  ;
                  *pfVar8 = *pfVar8 - fVar15;
                  if (lVar2 == 1) {
LAB_00126323:
                    pfVar8 = pfVar8 + 1;
                  }
                  else {
                    fVar15 = expandGaussPixel<float>
                                       ((p->
                                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7,1,lVar14,
                                        j);
                    pfVar8[1] = pfVar8[1] - fVar15;
                    if (lVar2 < 5) {
                      pfVar8 = pfVar8 + 2;
                    }
                    else {
                      lVar9 = 2;
                      lVar13 = -8;
                      do {
                        fVar15 = expandGaussPixelInner<float>
                                           ((p->
                                            super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar7,lVar9
                                            ,lVar14,j);
                        pfVar8[lVar9] = pfVar8[lVar9] - fVar15;
                        lVar1 = (4 - lVar2) + lVar9;
                        lVar9 = lVar9 + 1;
                        lVar13 = lVar13 + -4;
                      } while (lVar1 != 1);
                      pfVar8 = (float *)((long)pfVar8 - lVar13);
                    }
                    if (2 < lVar2) {
                      fVar15 = expandGaussPixel<float>
                                         ((p->
                                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                          lVar2 + -2,lVar14,j);
                      *pfVar8 = *pfVar8 - fVar15;
                      if (lVar2 == 3) goto LAB_00126323;
                      fVar15 = expandGaussPixel<float>
                                         ((p->
                                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                          lVar2 + -1,lVar14,j);
                      pfVar8[1] = pfVar8[1] - fVar15;
                      pfVar8 = pfVar8 + 2;
                    }
                  }
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != lVar5);
            }
            lVar14 = lVar11;
            if (0 < lVar3) {
              do {
                if (0 < lVar2) {
                  lVar13 = 0;
                  lVar9 = 0;
                  do {
                    fVar15 = expandGaussPixel<float>
                                       ((p->
                                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7,lVar9,
                                        lVar14,j);
                    pfVar8[lVar9] = pfVar8[lVar9] - fVar15;
                    lVar9 = lVar9 + 1;
                    lVar13 = lVar13 + -4;
                  } while (lVar2 != lVar9);
                  pfVar8 = (float *)((long)pfVar8 - lVar13);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < lVar3);
            }
          }
          lVar12 = lVar12 + 1;
          pIVar10 = (p->
                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (lVar12 < pIVar10[uVar6].depth);
      }
      uVar6 = uVar7;
    } while (uVar7 != iVar4 - 1);
  }
  return;
}

Assistant:

void createLaplacianPyramid(std::vector<ImageFloat> &p,
  const Image<T> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image

  p[0].setImage(image);

  // for all other levels

  for (int l=0; l<n-1; l++)
  {
    // compute downscaled Gaussian image for next level

    reduceGauss(p[l+1], p[l]);

    // compute Laplacian as difference of Gaussian

    const long w=p[l].getWidth();
    const long h=p[l].getHeight();

    // for all color channels

    for (int d=0; d<p[l].getDepth(); d++)
    {
      float *px=p[l].getPtr(0, 0, d);
      for (long k=0; k<2 && k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }

      for (long k=2; k<h-2; k++)
      {
        if (w > 0) *px++-=expandGaussPixel(p[l+1], 0, k, d);
        if (w > 1) *px++-=expandGaussPixel(p[l+1], 1, k, d);

        for (long i=2; i<w-2; i++)
        {
          *px++-=expandGaussPixelInner(p[l+1], i, k, d);
        }

        if (w > 2) *px++-=expandGaussPixel(p[l+1], w-2, k, d);
        if (w > 3) *px++-=expandGaussPixel(p[l+1], w-1, k, d);
      }

      for (long k=std::max(0l, h-2); k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }
    }
  }
}